

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHTTP.cpp
# Opt level: O0

void __thiscall adios2::transport::FileHTTP::~FileHTTP(FileHTTP *this)

{
  FileHTTP *in_RDI;
  
  ~FileHTTP(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

FileHTTP::~FileHTTP()
{
    if (m_IsOpen)
    {
    }
}